

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O1

istream * operator>>(istream *in,Address *a)

{
  string street;
  string city;
  string country;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  std::operator>>(in,(string *)&local_48);
  local_60 = 0;
  local_58 = 0;
  local_68 = &local_58;
  std::operator>>(in,(string *)&local_68);
  local_80 = 0;
  local_78 = 0;
  local_88 = &local_78;
  std::operator>>(in,(string *)&local_88);
  std::__cxx11::string::_M_assign((string *)a);
  std::__cxx11::string::_M_assign((string *)&a->city);
  std::__cxx11::string::_M_assign((string *)&a->street);
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return in;
}

Assistant:

istream &operator>>(istream &in, Address &a) {
    // take each string line by line or separated by space
    string country;
    in >> country;
    string city;
    in >> city;
    string street;
    in >> street;
    a.country = country;
    a.city = city;
    a.street = street;
    return in;
}